

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_trigger_note(xm_context_t *ctx,xm_channel_context_t *ch,uint flags)

{
  xm_frequency_type_t xVar1;
  xm_sample_t *pxVar2;
  uint64_t uVar3;
  float fVar4;
  
  if ((flags & 4) == 0) {
    ch->sample_position = 0.0;
    ch->ping = true;
  }
  pxVar2 = ch->sample;
  if (pxVar2 != (xm_sample_t *)0x0) {
    if ((flags & 1) == 0) {
      ch->volume = pxVar2->volume;
    }
    ch->panning = pxVar2->panning;
  }
  if ((flags & 8) == 0) {
    ch->sustained = true;
    ch->fadeout_volume = 1.0;
    ch->volume_envelope_volume = 1.0;
    ch->panning_envelope_panning = 0.5;
    ch->volume_envelope_frame_count = 0;
    ch->panning_envelope_frame_count = 0;
  }
  ch->vibrato_note_offset = 0.0;
  ch->tremolo_volume = 0.0;
  ch->tremor_on = false;
  ch->autovibrato_ticks = 0;
  if (ch->vibrato_waveform_retrigger == true) {
    ch->vibrato_ticks = 0;
  }
  if (ch->tremolo_waveform_retrigger == true) {
    ch->tremolo_ticks = '\0';
  }
  if ((flags & 2) == 0) {
    xVar1 = (ctx->module).frequency_type;
    if (xVar1 == XM_AMIGA_FREQUENCIES) {
      fVar4 = xm_amiga_period(ch->note);
    }
    else {
      fVar4 = 0.0;
      if (xVar1 == XM_LINEAR_FREQUENCIES) {
        fVar4 = ch->note * -64.0 + 7680.0;
      }
    }
    ch->period = fVar4;
    xm_update_frequency(ctx,ch);
  }
  uVar3 = ctx->generated_samples;
  ch->latest_trigger = uVar3;
  if (ch->instrument != (xm_instrument_t *)0x0) {
    ch->instrument->latest_trigger = uVar3;
  }
  if (ch->sample != (xm_sample_t *)0x0) {
    ch->sample->latest_trigger = uVar3;
  }
  return;
}

Assistant:

static void xm_trigger_note(xm_context_t* ctx, xm_channel_context_t* ch, unsigned int flags) {
	if(!(flags & XM_TRIGGER_KEEP_SAMPLE_POSITION)) {
		ch->sample_position = 0.f;
		ch->ping = true;
	}

	if(ch->sample != NULL) {
		if(!(flags & XM_TRIGGER_KEEP_VOLUME)) {
			ch->volume = ch->sample->volume;
		}

		ch->panning = ch->sample->panning;
	}

	if(!(flags & XM_TRIGGER_KEEP_ENVELOPE)) {
		ch->sustained = true;
		ch->fadeout_volume = ch->volume_envelope_volume = 1.0f;
		ch->panning_envelope_panning = .5f;
		ch->volume_envelope_frame_count = ch->panning_envelope_frame_count = 0;
	}
	ch->vibrato_note_offset = 0.f;
	ch->tremolo_volume = 0.f;
	ch->tremor_on = false;

	ch->autovibrato_ticks = 0;

	if(ch->vibrato_waveform_retrigger) {
		ch->vibrato_ticks = 0; /* XXX: should the waveform itself also
								* be reset to sine? */
	}
	if(ch->tremolo_waveform_retrigger) {
		ch->tremolo_ticks = 0;
	}

	if(!(flags & XM_TRIGGER_KEEP_PERIOD)) {
		ch->period = xm_period(ctx, ch->note);
		xm_update_frequency(ctx, ch);
	}

	ch->latest_trigger = ctx->generated_samples;
	if(ch->instrument != NULL) {
		ch->instrument->latest_trigger = ctx->generated_samples;
	}
	if(ch->sample != NULL) {
		ch->sample->latest_trigger = ctx->generated_samples;
	}
}